

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int toAscii(ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  char buf [1];
  char *p;
  char *ptr_local;
  
  p = buf;
  ptr_local = ptr;
  (*enc->utf8Convert)(enc,&ptr_local,end,&p,(char *)&p);
  iVar1 = -1;
  if (p != buf) {
    iVar1 = (int)buf[0];
  }
  return iVar1;
}

Assistant:

static
int toAscii(const ENCODING *enc, const char *ptr, const char *end)
{
  char buf[1];
  char *p = buf;
  XmlUtf8Convert(enc, &ptr, end, &p, p + 1);
  if (p == buf)
    return -1;
  else
    return buf[0];
}